

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall
OpenMesh::PropertyT<unsigned_short>::swap(PropertyT<unsigned_short> *this,size_t _i0,size_t _i1)

{
  unsigned_short uVar1;
  pointer puVar2;
  
  puVar2 = (this->data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar1 = puVar2[_i0];
  puVar2[_i0] = puVar2[_i1];
  puVar2[_i1] = uVar1;
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }